

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_1::GLPositionCase::init
          (GLPositionCase *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  bool bVar2;
  int iVar3;
  RenderTarget *renderTarget;
  char *pcVar4;
  ShaderProgram *pSVar5;
  RenderContext *renderCtx;
  Context *pCVar6;
  ProgramSources *pPVar7;
  TestLog *log;
  TestError *this_00;
  undefined1 usePointMode;
  char *pcVar8;
  undefined7 uVar9;
  bool local_789;
  bool local_77a;
  string local_778;
  ShaderSource local_758;
  string local_730;
  ShaderSource local_710;
  string local_6e8;
  ShaderSource local_6c8;
  string local_6a0;
  ShaderSource local_680;
  ProgramSources local_658;
  SharedPtr<const_glu::ShaderProgram> local_588;
  allocator<char> local_571;
  string local_570 [8];
  string fragmentShaderTemplate;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_530;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_470;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_450;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_410;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  undefined1 local_290 [8];
  string tessellationEvaluationTemplate;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  undefined1 local_168 [8];
  string tessellationControlTemplate;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  undefined1 local_c0 [8];
  string vertexShaderTemplate;
  undefined1 local_98 [8];
  string tesIn2;
  undefined1 local_70 [8];
  string tesIn1;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string tesIn0;
  bool tcsToTES;
  bool vsToTCS;
  GLPositionCase *this_local;
  
  checkTessellationSupport((this->super_TestCase).m_context);
  renderTarget = gles31::Context::getRenderTarget((this->super_TestCase).m_context);
  checkRenderTargetSize(renderTarget,0x100);
  local_77a = true;
  if (this->m_caseType != CASETYPE_VS_TO_TCS) {
    local_77a = this->m_caseType == CASETYPE_VS_TO_TCS_TO_TES;
  }
  tesIn0.field_2._M_local_buf[0xf] = local_77a;
  local_789 = true;
  if (this->m_caseType != CASETYPE_TCS_TO_TES) {
    local_789 = this->m_caseType == CASETYPE_VS_TO_TCS_TO_TES;
  }
  tesIn0.field_2._M_local_buf[0xe] = local_789;
  pcVar4 = "in_te_attr[0]";
  if (local_789 != false) {
    pcVar4 = "gl_in[0].gl_Position";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,pcVar4,&local_39);
  std::allocator<char>::~allocator(&local_39);
  pcVar4 = "in_te_attr[1]";
  if ((tesIn0.field_2._M_local_buf[0xe] & 1U) != 0) {
    pcVar4 = "gl_in[1].gl_Position";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_70,pcVar4,(allocator<char> *)(tesIn2.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(tesIn2.field_2._M_local_buf + 0xf));
  pcVar4 = "in_te_attr[2]";
  if ((tesIn0.field_2._M_local_buf[0xe] & 1U) != 0) {
    pcVar4 = "gl_in[2].gl_Position";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_98,pcVar4,
             (allocator<char> *)(vertexShaderTemplate.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator
            ((allocator<char> *)(vertexShaderTemplate.field_2._M_local_buf + 0xf));
  pcVar4 = "out highp vec4 in_tc_attr;\n";
  if ((tesIn0.field_2._M_local_buf[0xf] & 1U) != 0) {
    pcVar4 = "";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_140,pcVar4,
             (allocator<char> *)(tessellationControlTemplate.field_2._M_local_buf + 0xf));
  std::operator+(&local_120,"${GLSL_VERSION_DECL}\n\nin highp vec4 in_v_attr;\n",&local_140);
  std::operator+(&local_100,&local_120,"\nvoid main (void)\n{\n\t");
  pcVar4 = "in_tc_attr";
  if ((tesIn0.field_2._M_local_buf[0xf] & 1U) != 0) {
    pcVar4 = "gl_Position";
  }
  std::operator+(&local_e0,&local_100,pcVar4);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
                 &local_e0," = in_v_attr;\n}\n");
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_140);
  std::allocator<char>::~allocator
            ((allocator<char> *)(tessellationControlTemplate.field_2._M_local_buf + 0xf));
  pcVar8 = "";
  pcVar4 = "in highp vec4 in_tc_attr[];\n";
  if ((tesIn0.field_2._M_local_buf[0xf] & 1U) != 0) {
    pcVar4 = "";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_268,pcVar4,
             (allocator<char> *)(tessellationEvaluationTemplate.field_2._M_local_buf + 0xf));
  std::operator+(&local_248,
                 "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n\nlayout (vertices = 3) out;\n\n"
                 ,&local_268);
  std::operator+(&local_228,&local_248,"\n");
  uVar9 = (undefined7)((ulong)pcVar8 >> 8);
  pcVar4 = "out highp vec4 in_te_attr[];\n";
  if ((tesIn0.field_2._M_local_buf[0xe] & 1U) != 0) {
    pcVar4 = "";
  }
  std::operator+(&local_208,&local_228,pcVar4);
  std::operator+(&local_1e8,&local_208,"\nvoid main (void)\n{\n\t");
  pcVar4 = "in_te_attr[gl_InvocationID]";
  if ((tesIn0.field_2._M_local_buf[0xe] & 1U) != 0) {
    pcVar4 = "gl_out[gl_InvocationID].gl_Position";
  }
  std::operator+(&local_1c8,&local_1e8,pcVar4);
  std::operator+(&local_1a8,&local_1c8," = ");
  pcVar4 = "in_tc_attr[gl_InvocationID]";
  if ((tesIn0.field_2._M_local_buf[0xf] & 1U) != 0) {
    pcVar4 = "gl_in[gl_InvocationID].gl_Position";
  }
  usePointMode = tesIn0.field_2._M_local_buf[0xf];
  std::operator+(&local_188,&local_1a8,pcVar4);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168,
                 &local_188,
                 ";\n\n\tgl_TessLevelInner[0] = 2.0;\n\tgl_TessLevelInner[1] = 3.0;\n\n\tgl_TessLevelOuter[0] = 4.0;\n\tgl_TessLevelOuter[1] = 5.0;\n\tgl_TessLevelOuter[2] = 6.0;\n\tgl_TessLevelOuter[3] = 7.0;\n}\n"
                );
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::__cxx11::string::~string((string *)&local_208);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_248);
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator
            ((allocator<char> *)(tessellationEvaluationTemplate.field_2._M_local_buf + 0xf));
  Functional::(anonymous_namespace)::getTessellationEvaluationInLayoutString_abi_cxx11_
            ((string *)((long)&fragmentShaderTemplate.field_2 + 8),(_anonymous_namespace_ *)0x0,
             TESSPRIMITIVETYPE_TRIANGLES,(bool)usePointMode);
  std::operator+(&local_530,"${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n\n",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&fragmentShaderTemplate.field_2 + 8));
  std::operator+(&local_510,&local_530,"\n");
  pcVar4 = (char *)CONCAT71(uVar9,tesIn0.field_2._M_local_buf[0xe]);
  pcVar8 = "in highp vec4 in_te_attr[];\n";
  if ((tesIn0.field_2._M_local_buf[0xe] & 1U) != 0) {
    pcVar8 = "";
  }
  std::operator+(&local_4f0,&local_510,pcVar8);
  std::operator+(&local_4d0,&local_4f0,
                 "\nout highp vec4 in_f_color;\n\nvoid main (void)\n{\n\thighp vec2 xy = gl_TessCoord.x * "
                );
  std::operator+(&local_4b0,&local_4d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  std::operator+(&local_490,&local_4b0,".xy\n\t              + gl_TessCoord.y * ");
  std::operator+(&local_470,&local_490,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
  std::operator+(&local_450,&local_470,".xy\n\t              + gl_TessCoord.z * ");
  std::operator+(&local_430,&local_450,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
  std::operator+(&local_410,&local_430,
                 ".xy;\n\tgl_Position = vec4(xy, 0.0, 1.0);\n\tin_f_color = vec4(");
  std::operator+(&local_3f0,&local_410,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  std::operator+(&local_3d0,&local_3f0,".z + ");
  std::operator+(&local_3b0,&local_3d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
  std::operator+(&local_390,&local_3b0,".w,\n\t                  ");
  std::operator+(&local_370,&local_390,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
  std::operator+(&local_350,&local_370,".z + ");
  std::operator+(&local_330,&local_350,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  std::operator+(&local_310,&local_330,".w,\n\t                  ");
  std::operator+(&local_2f0,&local_310,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70);
  std::operator+(&local_2d0,&local_2f0,".z + ");
  std::operator+(&local_2b0,&local_2d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_290,
                 &local_2b0,".w,\n\t                  1.0);\n}\n");
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_350);
  std::__cxx11::string::~string((string *)&local_370);
  std::__cxx11::string::~string((string *)&local_390);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::~string((string *)&local_410);
  std::__cxx11::string::~string((string *)&local_430);
  std::__cxx11::string::~string((string *)&local_450);
  std::__cxx11::string::~string((string *)&local_470);
  std::__cxx11::string::~string((string *)&local_490);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::__cxx11::string::~string((string *)&local_4d0);
  std::__cxx11::string::~string((string *)&local_4f0);
  std::__cxx11::string::~string((string *)&local_510);
  std::__cxx11::string::~string((string *)&local_530);
  std::__cxx11::string::~string((string *)(fragmentShaderTemplate.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_570,
             "${GLSL_VERSION_DECL}\n\nlayout (location = 0) out mediump vec4 o_color;\n\nin highp vec4 in_f_color;\n\nvoid main (void)\n{\n\to_color = in_f_color;\n}\n"
             ,&local_571);
  std::allocator<char>::~allocator(&local_571);
  pSVar5 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  glu::ProgramSources::ProgramSources(&local_658);
  pCVar1 = (this->super_TestCase).m_context;
  pCVar6 = (Context *)std::__cxx11::string::c_str();
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_6a0,(_anonymous_namespace_ *)pCVar1,pCVar6,pcVar4);
  glu::VertexSource::VertexSource((VertexSource *)&local_680,&local_6a0);
  pPVar7 = glu::ProgramSources::operator<<(&local_658,&local_680);
  pCVar1 = (this->super_TestCase).m_context;
  pCVar6 = (Context *)std::__cxx11::string::c_str();
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_6e8,(_anonymous_namespace_ *)pCVar1,pCVar6,pcVar4);
  glu::TessellationControlSource::TessellationControlSource
            ((TessellationControlSource *)&local_6c8,&local_6e8);
  pPVar7 = glu::ProgramSources::operator<<(pPVar7,&local_6c8);
  pCVar1 = (this->super_TestCase).m_context;
  pCVar6 = (Context *)std::__cxx11::string::c_str();
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_730,(_anonymous_namespace_ *)pCVar1,pCVar6,pcVar4);
  glu::TessellationEvaluationSource::TessellationEvaluationSource
            ((TessellationEvaluationSource *)&local_710,&local_730);
  pPVar7 = glu::ProgramSources::operator<<(pPVar7,&local_710);
  pCVar1 = (this->super_TestCase).m_context;
  pCVar6 = (Context *)std::__cxx11::string::c_str();
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_778,(_anonymous_namespace_ *)pCVar1,pCVar6,pcVar4);
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_758,&local_778);
  pPVar7 = glu::ProgramSources::operator<<(pPVar7,&local_758);
  glu::ShaderProgram::ShaderProgram(pSVar5,renderCtx,pPVar7);
  de::SharedPtr<const_glu::ShaderProgram>::SharedPtr(&local_588,pSVar5);
  de::SharedPtr<const_glu::ShaderProgram>::operator=(&this->m_program,&local_588);
  de::SharedPtr<const_glu::ShaderProgram>::~SharedPtr(&local_588);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_758);
  std::__cxx11::string::~string((string *)&local_778);
  glu::TessellationEvaluationSource::~TessellationEvaluationSource
            ((TessellationEvaluationSource *)&local_710);
  std::__cxx11::string::~string((string *)&local_730);
  glu::TessellationControlSource::~TessellationControlSource
            ((TessellationControlSource *)&local_6c8);
  std::__cxx11::string::~string((string *)&local_6e8);
  glu::VertexSource::~VertexSource((VertexSource *)&local_680);
  std::__cxx11::string::~string((string *)&local_6a0);
  glu::ProgramSources::~ProgramSources(&local_658);
  log = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  pSVar5 = de::SharedPtr<const_glu::ShaderProgram>::operator*(&this->m_program);
  glu::operator<<(log,pSVar5);
  pSVar5 = de::SharedPtr<const_glu::ShaderProgram>::operator->(&this->m_program);
  bVar2 = glu::ShaderProgram::isOk(pSVar5);
  if (!bVar2) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Program compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
               ,0x1914);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  std::__cxx11::string::~string(local_570);
  std::__cxx11::string::~string((string *)local_290);
  std::__cxx11::string::~string((string *)local_168);
  std::__cxx11::string::~string((string *)local_c0);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)local_70);
  iVar3 = std::__cxx11::string::~string((string *)local_38);
  return iVar3;
}

Assistant:

void GLPositionCase::init (void)
{
	checkTessellationSupport(m_context);
	checkRenderTargetSize(m_context.getRenderTarget(), RENDER_SIZE);

	const bool		vsToTCS		= m_caseType == CASETYPE_VS_TO_TCS		|| m_caseType == CASETYPE_VS_TO_TCS_TO_TES;
	const bool		tcsToTES	= m_caseType == CASETYPE_TCS_TO_TES		|| m_caseType == CASETYPE_VS_TO_TCS_TO_TES;

	const string	tesIn0		= tcsToTES ? "gl_in[0].gl_Position" : "in_te_attr[0]";
	const string	tesIn1		= tcsToTES ? "gl_in[1].gl_Position" : "in_te_attr[1]";
	const string	tesIn2		= tcsToTES ? "gl_in[2].gl_Position" : "in_te_attr[2]";

	std::string vertexShaderTemplate			("${GLSL_VERSION_DECL}\n"
												 "\n"
												 "in highp vec4 in_v_attr;\n"
												 + string(!vsToTCS ? "out highp vec4 in_tc_attr;\n" : "") +
												 "\n"
												 "void main (void)\n"
												 "{\n"
												 "	" + (vsToTCS ? "gl_Position" : "in_tc_attr") + " = in_v_attr;\n"
												 "}\n");
	std::string tessellationControlTemplate		("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
												 "\n"
												 "layout (vertices = 3) out;\n"
												 "\n"
												 + string(!vsToTCS ? "in highp vec4 in_tc_attr[];\n" : "") +
												 "\n"
												 + (!tcsToTES ? "out highp vec4 in_te_attr[];\n" : "") +
												 "\n"
												 "void main (void)\n"
												 "{\n"
												 "	" + (tcsToTES ? "gl_out[gl_InvocationID].gl_Position" : "in_te_attr[gl_InvocationID]") + " = "
													  + (vsToTCS ? "gl_in[gl_InvocationID].gl_Position" : "in_tc_attr[gl_InvocationID]") + ";\n"
												 "\n"
												 "	gl_TessLevelInner[0] = 2.0;\n"
												 "	gl_TessLevelInner[1] = 3.0;\n"
												 "\n"
												 "	gl_TessLevelOuter[0] = 4.0;\n"
												 "	gl_TessLevelOuter[1] = 5.0;\n"
												 "	gl_TessLevelOuter[2] = 6.0;\n"
												 "	gl_TessLevelOuter[3] = 7.0;\n"
												 "}\n");
	std::string tessellationEvaluationTemplate	("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
												 "\n"
												 + getTessellationEvaluationInLayoutString(TESSPRIMITIVETYPE_TRIANGLES) +
												 "\n"
												 + (!tcsToTES ? "in highp vec4 in_te_attr[];\n" : "") +
												 "\n"
												 "out highp vec4 in_f_color;\n"
												 "\n"
												 "void main (void)\n"
												 "{\n"
												 "	highp vec2 xy = gl_TessCoord.x * " + tesIn0 + ".xy\n"
												 "	              + gl_TessCoord.y * " + tesIn1 + ".xy\n"
												 "	              + gl_TessCoord.z * " + tesIn2 + ".xy;\n"
												 "	gl_Position = vec4(xy, 0.0, 1.0);\n"
												 "	in_f_color = vec4(" + tesIn0 + ".z + " + tesIn1 + ".w,\n"
												 "	                  " + tesIn2 + ".z + " + tesIn0 + ".w,\n"
												 "	                  " + tesIn1 + ".z + " + tesIn2 + ".w,\n"
												 "	                  1.0);\n"
												 "}\n");
	std::string fragmentShaderTemplate			("${GLSL_VERSION_DECL}\n"
												 "\n"
												 "layout (location = 0) out mediump vec4 o_color;\n"
												 "\n"
												 "in highp vec4 in_f_color;\n"
												 "\n"
												 "void main (void)\n"
												 "{\n"
												 "	o_color = in_f_color;\n"
												 "}\n");

	m_program = SharedPtr<const ShaderProgram>(new ShaderProgram(m_context.getRenderContext(), glu::ProgramSources()
		<< glu::VertexSource					(specializeShader(m_context, vertexShaderTemplate.c_str()))
		<< glu::TessellationControlSource		(specializeShader(m_context, tessellationControlTemplate.c_str()))
		<< glu::TessellationEvaluationSource	(specializeShader(m_context, tessellationEvaluationTemplate.c_str()))
		<< glu::FragmentSource					(specializeShader(m_context, fragmentShaderTemplate.c_str()))));

	m_testCtx.getLog() << *m_program;
	if (!m_program->isOk())
		TCU_FAIL("Program compilation failed");
}